

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  ZSTD_Sequence *pZVar1;
  BYTE *pBVar2;
  BYTE **ppBVar3;
  uint uVar4;
  ZSTD_CDict *pZVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  undefined8 uVar7;
  BYTE *pBVar8;
  seqDef *psVar9;
  bool bVar10;
  uint *puVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  size_t sVar15;
  long lVar16;
  U32 offCode;
  ulong uVar17;
  uint uVar18;
  ZSTD_Sequence *pZVar19;
  uint uVar20;
  uint local_80 [4];
  ZSTD_sequencePosition *local_70;
  size_t local_68;
  BYTE *local_60;
  ulong local_58;
  size_t local_50;
  ulong local_48;
  BYTE *local_40;
  ZSTD_Sequence *local_38;
  
  uVar20 = seqPos->idx;
  uVar12 = (ulong)uVar20;
  pZVar5 = cctx->cdict;
  if (pZVar5 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict != (void *)0x0) {
      pZVar5 = (ZSTD_CDict *)&cctx->prefixDict;
      goto LAB_0077b120;
    }
    local_58 = 0;
  }
  else {
LAB_0077b120:
    local_58 = (ulong)(uint)pZVar5->dictContentSize;
  }
  local_60 = (BYTE *)(blockSize + (long)src);
  pZVar6 = (cctx->blockState).prevCBlock;
  local_80[2] = pZVar6->rep[2];
  uVar7 = *(undefined8 *)pZVar6->rep;
  local_80[0] = (uint)uVar7;
  local_80[1] = (uint)((ulong)uVar7 >> 0x20);
  pZVar19 = inSeqs;
  local_70 = seqPos;
  local_50 = inSeqsSize;
  local_48 = uVar12;
  if (uVar12 < inSeqsSize) {
    local_40 = local_60 + -0x20;
    local_38 = inSeqs;
    do {
      uVar20 = (uint)uVar12;
      pZVar1 = local_38 + uVar12;
      uVar4 = local_38[uVar12].matchLength;
      if (((ulong)uVar4 == 0) && (pZVar19 = local_38, pZVar1->offset == 0)) break;
      uVar18 = pZVar1->litLength;
      uVar12 = (ulong)uVar18;
      if (externalRepSearch == ZSTD_ps_disable) {
        if (pZVar1->offset == 0) {
          __assert_fail("(inSeqs[idx].offset)>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x1916,
                        "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                       );
        }
        offCode = pZVar1->offset + 3;
      }
      else {
        offCode = ZSTD_finalizeOffBase(pZVar1->offset,local_80,(uint)(uVar12 == 0));
        uVar14 = local_80[1];
        if (offCode < 4) {
          if (offCode == 0) {
            __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2d5,"void ZSTD_updateRep(U32 *, const U32, const U32)");
          }
          uVar14 = offCode - (uVar12 != 0);
          if (uVar14 != 0) {
            if (uVar14 == 3) {
              uVar13 = local_80[0] - 1;
            }
            else {
              uVar13 = local_80[uVar14];
            }
            puVar11 = local_80 + 1;
            if (uVar14 == 1) {
              puVar11 = local_80 + 2;
            }
            local_80[2] = *puVar11;
            local_80[1] = local_80[0];
            local_80[0] = uVar13;
          }
        }
        else {
          local_80[1] = local_80[0];
          local_80[2] = uVar14;
          local_80[0] = offCode - 3;
        }
      }
      if ((cctx->appliedParams).validateSequences == 0) {
LAB_0077b285:
        if ((cctx->seqStore).maxNbSeq <= (ulong)(uVar20 - local_70->idx)) {
          local_68 = 0xffffffffffffff95;
          sVar15 = local_68;
          goto LAB_0077b318;
        }
        if ((cctx->seqStore).maxNbSeq <=
            (ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart >> 3))
        {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar17 = (cctx->seqStore).maxNbLit;
        if (0x20000 < uVar17) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        pBVar8 = (cctx->seqStore).lit;
        if ((cctx->seqStore).litStart + uVar17 < pBVar8 + uVar12) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        pBVar2 = (BYTE *)((long)src + uVar12);
        if (local_60 < pBVar2) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_40 < pBVar2) {
          ZSTD_safecopyLiterals(pBVar8,(BYTE *)src,pBVar2,local_40);
        }
        else {
          uVar7 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar8 = *src;
          *(undefined8 *)(pBVar8 + 8) = uVar7;
          if (0x10 < uVar18) {
            pBVar8 = (cctx->seqStore).lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar8 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar8 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar8 + 0x18) = uVar7;
            if (0x20 < uVar18) {
              lVar16 = 0;
              do {
                uVar7 = *(undefined8 *)((BYTE *)((long)src + lVar16 + 0x20) + 8);
                pBVar2 = pBVar8 + lVar16 + 0x20;
                *(undefined8 *)pBVar2 = *(undefined8 *)((long)src + lVar16 + 0x20);
                *(undefined8 *)(pBVar2 + 8) = uVar7;
                uVar7 = *(undefined8 *)((BYTE *)((long)src + lVar16 + 0x30) + 8);
                *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)((long)src + lVar16 + 0x30);
                *(undefined8 *)(pBVar2 + 0x18) = uVar7;
                lVar16 = lVar16 + 0x20;
              } while (pBVar2 + 0x20 < pBVar8 + uVar12);
            }
          }
        }
        ppBVar3 = &(cctx->seqStore).lit;
        *ppBVar3 = *ppBVar3 + uVar12;
        if (0xffff < uVar18) {
          if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
          (cctx->seqStore).longLengthPos =
               (U32)((ulong)((long)(cctx->seqStore).sequences -
                            (long)(cctx->seqStore).sequencesStart) >> 3);
        }
        psVar9 = (cctx->seqStore).sequences;
        psVar9->litLength = (U16)uVar18;
        psVar9->offBase = offCode;
        if (uVar4 < 3) {
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar12 = (ulong)uVar4 - 3;
        if (0xffff < uVar12) {
          if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
          (cctx->seqStore).longLengthPos =
               (U32)((ulong)((long)psVar9 - (long)(cctx->seqStore).sequencesStart) >> 3);
        }
        psVar9->mlBase = (U16)uVar12;
        (cctx->seqStore).sequences = psVar9 + 1;
        src = (void *)((long)src + (ulong)(uVar4 + uVar18));
        bVar10 = true;
      }
      else {
        sVar15 = (ulong)(uVar18 + uVar4) + local_70->posInSrc;
        local_70->posInSrc = sVar15;
        sVar15 = ZSTD_validateSequence
                           (offCode,uVar4,(cctx->appliedParams).cParams.minMatch,sVar15,
                            (cctx->appliedParams).cParams.windowLog,local_58,
                            (cctx->appliedParams).useSequenceProducer);
        if (sVar15 < 0xffffffffffffff89) goto LAB_0077b285;
LAB_0077b318:
        local_68 = sVar15;
        bVar10 = false;
      }
      if (!bVar10) {
        return local_68;
      }
      uVar20 = uVar20 + 1;
      uVar12 = (ulong)uVar20;
      pZVar19 = local_38;
    } while (uVar12 < local_50);
  }
  uVar4 = local_80[1];
  if (externalRepSearch == ZSTD_ps_auto) {
    __assert_fail("externalRepSearch != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x192b,
                  "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                 );
  }
  uVar18 = (uint)local_48;
  if (uVar20 < uVar18) {
    __assert_fail("idx >= startIdx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x192c,
                  "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                 );
  }
  if (uVar20 == uVar18 || externalRepSearch != ZSTD_ps_disable) goto LAB_0077b508;
  uVar14 = uVar20 - 1;
  if (uVar14 < uVar18 + 2) {
    if (uVar20 == uVar18 + 2) goto LAB_0077b4c1;
    if (uVar14 != uVar18) {
      __assert_fail("lastSeqIdx == startIdx",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x193a,
                    "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                   );
    }
    local_80[1] = local_80[0];
    local_80[2] = uVar4;
  }
  else {
    local_80[0] = pZVar19[uVar20 - 3].offset;
LAB_0077b4c1:
    local_80[1] = pZVar19[uVar20 - 2].offset;
    local_80[2] = local_80[0];
  }
  local_80[0] = pZVar19[uVar14].offset;
LAB_0077b508:
  pZVar6 = (cctx->blockState).nextCBlock;
  pZVar6->rep[2] = local_80[2];
  *(ulong *)pZVar6->rep = CONCAT44(local_80[1],local_80[0]);
  uVar17 = (ulong)pZVar19[uVar12].litLength;
  if (uVar17 != 0) {
    memcpy((cctx->seqStore).lit,src,uVar17);
    ppBVar3 = &(cctx->seqStore).lit;
    *ppBVar3 = *ppBVar3 + uVar17;
    src = (void *)((long)src + (ulong)pZVar19[uVar12].litLength);
    local_70->posInSrc = local_70->posInSrc + (ulong)pZVar19[uVar12].litLength;
  }
  sVar15 = 0xffffffffffffff95;
  if ((BYTE *)src == local_60) {
    local_70->idx = uVar20 + 1;
    sVar15 = 0;
  }
  return sVar15;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx* cctx,
                                              ZSTD_sequencePosition* seqPos,
                                        const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                        const void* src, size_t blockSize,
                                        ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 const startIdx = idx;
    BYTE const* ip = (BYTE const*)(src);
    const BYTE* const iend = ip + blockSize;
    repcodes_t updatedRepcodes;
    U32 dictSize;

    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreExplicitBlockDelim (blockSize = %zu)", blockSize);

    if (cctx->cdict) {
        dictSize = (U32)cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = (U32)cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (; idx < inSeqsSize && (inSeqs[idx].matchLength != 0 || inSeqs[idx].offset != 0); ++idx) {
        U32 const litLength = inSeqs[idx].litLength;
        U32 const matchLength = inSeqs[idx].matchLength;
        U32 offBase;

        if (externalRepSearch == ZSTD_ps_disable) {
            offBase = OFFSET_TO_OFFBASE(inSeqs[idx].offset);
        } else {
            U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(inSeqs[idx].offset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                cctx->appliedParams.cParams.windowLog, dictSize, cctx->appliedParams.useSequenceProducer),
                                                "Sequence validation failed");
        }
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
    }

    /* If we skipped repcode search while parsing, we need to update repcodes now */
    assert(externalRepSearch != ZSTD_ps_auto);
    assert(idx >= startIdx);
    if (externalRepSearch == ZSTD_ps_disable && idx != startIdx) {
        U32* const rep = updatedRepcodes.rep;
        U32 lastSeqIdx = idx - 1; /* index of last non-block-delimiter sequence */

        if (lastSeqIdx >= startIdx + 2) {
            rep[2] = inSeqs[lastSeqIdx - 2].offset;
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else if (lastSeqIdx == startIdx + 1) {
            rep[2] = rep[0];
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else {
            assert(lastSeqIdx == startIdx);
            rep[2] = rep[1];
            rep[1] = rep[0];
            rep[0] = inSeqs[lastSeqIdx].offset;
        }
    }

    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    if (inSeqs[idx].litLength) {
        DEBUGLOG(6, "Storing last literals of size: %u", inSeqs[idx].litLength);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, inSeqs[idx].litLength);
        ip += inSeqs[idx].litLength;
        seqPos->posInSrc += inSeqs[idx].litLength;
    }
    RETURN_ERROR_IF(ip != iend, externalSequences_invalid, "Blocksize doesn't agree with block delimiter!");
    seqPos->idx = idx+1;
    return 0;
}